

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O0

void __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
accept<asio::ip::tcp,asio::any_io_executor>
          (basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *this,
          basic_socket<asio::ip::tcp,_asio::any_io_executor> *peer,type param_2)

{
  service_type *this_00;
  implementation_type *impl;
  undefined1 local_30 [8];
  error_code ec;
  type param_2_local;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *peer_local;
  basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this_local;
  
  ec._M_cat._4_4_ = param_2;
  std::error_code::error_code((error_code *)local_30);
  this_00 = detail::
            io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
            ::get_service((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                           *)this);
  impl = detail::
         io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
         ::get_implementation
                   ((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                     *)this);
  detail::reactive_socket_service<asio::ip::tcp>::
  accept<asio::basic_socket<asio::ip::tcp,asio::any_io_executor>>
            (this_00,impl,peer,(endpoint_type *)0x0,(error_code *)local_30);
  detail::throw_error((error_code *)local_30,"accept");
  return;
}

Assistant:

void accept(basic_socket<Protocol1, Executor1>& peer,
      typename constraint<
        is_convertible<Protocol, Protocol1>::value
      >::type = 0)
  {
    asio::error_code ec;
    impl_.get_service().accept(impl_.get_implementation(),
        peer, static_cast<endpoint_type*>(0), ec);
    asio::detail::throw_error(ec, "accept");
  }